

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O3

int CBS_get_asn1_implicit_string
              (CBS *in,CBS *out,uint8_t **out_storage,CBS_ASN1_TAG outer_tag,CBS_ASN1_TAG inner_tag)

{
  int iVar1;
  size_t len;
  uint8_t *data;
  CBS child;
  CBS chunk;
  CBB result;
  size_t local_90;
  uint8_t *local_88;
  CBS local_80;
  CBS local_70;
  CBB local_60;
  
  if ((outer_tag >> 0x1d & 1) != 0) {
    __assert_fail("!(outer_tag & CBS_ASN1_CONSTRUCTED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0xe1,
                  "int CBS_get_asn1_implicit_string(CBS *, CBS *, uint8_t **, CBS_ASN1_TAG, CBS_ASN1_TAG)"
                 );
  }
  if ((inner_tag >> 0x1d & 1) != 0) {
    __assert_fail("!(inner_tag & CBS_ASN1_CONSTRUCTED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0xe2,
                  "int CBS_get_asn1_implicit_string(CBS *, CBS *, uint8_t **, CBS_ASN1_TAG, CBS_ASN1_TAG)"
                 );
  }
  if ((0x1e < inner_tag) || ((0x5e7c1010U >> (inner_tag & 0x1f) & 1) == 0)) {
    __assert_fail("is_string_type(inner_tag)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0xe3,
                  "int CBS_get_asn1_implicit_string(CBS *, CBS *, uint8_t **, CBS_ASN1_TAG, CBS_ASN1_TAG)"
                 );
  }
  iVar1 = CBS_peek_asn1_tag(in,outer_tag);
  if (iVar1 != 0) {
    *out_storage = (uint8_t *)0x0;
    iVar1 = CBS_get_asn1(in,out,outer_tag);
    return iVar1;
  }
  iVar1 = CBB_init(&local_60,in->len);
  if ((iVar1 != 0) && (iVar1 = CBS_get_asn1(in,&local_80,outer_tag | 0x20000000), iVar1 != 0)) {
    if (local_80.len != 0) {
      do {
        iVar1 = CBS_get_asn1(&local_80,&local_70,inner_tag);
        if ((iVar1 == 0) ||
           (iVar1 = CBB_add_bytes(&local_60,local_70.data,local_70.len), iVar1 == 0))
        goto LAB_00209479;
      } while (local_80.len != 0);
    }
    iVar1 = CBB_finish(&local_60,&local_88,&local_90);
    if (iVar1 != 0) {
      out->data = local_88;
      out->len = local_90;
      *out_storage = local_88;
      return 1;
    }
  }
LAB_00209479:
  CBB_cleanup(&local_60);
  return 0;
}

Assistant:

int CBS_get_asn1_implicit_string(CBS *in, CBS *out, uint8_t **out_storage,
                                 CBS_ASN1_TAG outer_tag,
                                 CBS_ASN1_TAG inner_tag) {
  assert(!(outer_tag & CBS_ASN1_CONSTRUCTED));
  assert(!(inner_tag & CBS_ASN1_CONSTRUCTED));
  assert(is_string_type(inner_tag));

  if (CBS_peek_asn1_tag(in, outer_tag)) {
    // Normal implicitly-tagged string.
    *out_storage = NULL;
    return CBS_get_asn1(in, out, outer_tag);
  }

  // Otherwise, try to parse an implicitly-tagged constructed string.
  // |CBS_asn1_ber_to_der| is assumed to have run, so only allow one level deep
  // of nesting.
  CBB result;
  CBS child;
  if (!CBB_init(&result, CBS_len(in)) ||
      !CBS_get_asn1(in, &child, outer_tag | CBS_ASN1_CONSTRUCTED)) {
    goto err;
  }

  while (CBS_len(&child) > 0) {
    CBS chunk;
    if (!CBS_get_asn1(&child, &chunk, inner_tag) ||
        !CBB_add_bytes(&result, CBS_data(&chunk), CBS_len(&chunk))) {
      goto err;
    }
  }

  uint8_t *data;
  size_t len;
  if (!CBB_finish(&result, &data, &len)) {
    goto err;
  }

  CBS_init(out, data, len);
  *out_storage = data;
  return 1;

err:
  CBB_cleanup(&result);
  return 0;
}